

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

string * __thiscall
gnuplotio::Gnuplot::
binfmt<std::pair<std::vector<float,std::allocator<float>>,boost::tuples::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>,gnuplotio::Mode1D>
          (string *__return_storage_ptr__,undefined8 param_2,undefined8 arg,char *arr_or_rec)

{
  int iVar1;
  ostream *poVar2;
  ostringstream tmp;
  long *local_1e0 [2];
  long local_1d0 [6];
  undefined1 local_1a0 [376];
  
  iVar1 = std::__cxx11::string::compare(arr_or_rec);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare(arr_or_rec);
    if (iVar1 != 0) {
      __assert_fail("(arr_or_rec == \"array\") || (arr_or_rec == \"record\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/dstahlke[P]gnuplot-iostream/gnuplot-iostream.h"
                    ,0x706,
                    "std::string gnuplotio::Gnuplot::binfmt(const T &, const std::string &, OrganizationMode) [T = std::pair<std::vector<float>, boost::tuples::tuple<std::vector<double>, std::pair<std::vector<int>, std::vector<int>>, std::vector<float>>>, OrganizationMode = gnuplotio::Mode1D]"
                   );
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," format=\'",9);
  handle_colunwrap_tag<1ul,std::pair<std::vector<float,std::allocator<float>>,boost::tuples::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>,gnuplotio::ModeBinfmt>
            (local_1a0,arg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\' ",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,*(char **)arr_or_rec,*(long *)(arr_or_rec + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=(",2);
  handle_colunwrap_tag<1ul,std::pair<std::vector<float,std::allocator<float>>,boost::tuples::tuple<std::vector<double,std::allocator<double>>,std::pair<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>,std::vector<float,std::allocator<float>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>,gnuplotio::ModeSize>
            (local_1a0,arg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," ",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1e0);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string binfmt(const T &arg, const std::string &arr_or_rec, OrganizationMode) {
        assert((arr_or_rec == "array") || (arr_or_rec == "record"));
        std::string ret;
        try {
            std::ostringstream tmp;
            tmp << " format='";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeBinfmt());
            tmp << "' " << arr_or_rec << "=(";
            top_level_array_sender(tmp, arg, OrganizationMode(), ModeSize());
            tmp << ")";
            tmp << " ";
            ret = tmp.str();
        } catch(const plotting_empty_container &) {
            ret = std::string(" format='' ") + arr_or_rec + "=(0) ";
        }
        return ret;
    }